

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O0

void __thiscall CTB<UFPC>::SecondScan(CTB<UFPC> *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puStack_30;
  int c_i;
  uint *img_labels_row;
  uint *img_labels_row_end;
  uint *img_labels_row_start;
  int r_i;
  CTB<UFPC> *this_local;
  
  uVar1 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar1;
  for (img_labels_row_start._4_4_ = 0;
      img_labels_row_start._4_4_ <
      *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
      img_labels_row_start._4_4_ = img_labels_row_start._4_4_ + 1) {
    puStack_30 = cv::Mat::ptr<unsigned_int>
                           (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                             super_Mat,img_labels_row_start._4_4_);
    puVar2 = puStack_30 +
             *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc;
    for (; puStack_30 != puVar2; puStack_30 = puStack_30 + 1) {
      uVar1 = UFPC::GetLabel(*puStack_30);
      *puStack_30 = uVar1;
    }
  }
  return;
}

Assistant:

void SecondScan() 
    {
        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }
    }